

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slacking.hpp
# Opt level: O2

void __thiscall slack::_detail::Element::Element(Element *this,string *l,string *v)

{
  std::__cxx11::string::string((string *)this,(string *)l);
  std::__cxx11::string::string((string *)&this->value,(string *)v);
  return;
}

Assistant:

Element(const std::string& l, const std::string& v) : label(l), value(v) {}